

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_ARB1_DP2ADD(Context *ctx)

{
  size_t in_RCX;
  size_t in_RDX;
  size_t buflen;
  char scratch [64];
  char src2 [64];
  char src1 [64];
  char src0 [64];
  char dst [64];
  char acStack_178 [64];
  char local_138 [64];
  char local_f8 [64];
  char local_b8 [64];
  char local_78 [72];
  
  if (ctx->profile_supports_nv4 != 0) {
    emit_ARB1_opcode_dsss(ctx,"DP2A");
    return;
  }
  make_ARB1_destarg_string(ctx,local_78,in_RDX);
  make_ARB1_srcarg_string_in_buf(ctx,ctx->source_args,local_b8,in_RCX);
  make_ARB1_srcarg_string_in_buf(ctx,ctx->source_args + 1,local_f8,in_RCX);
  make_ARB1_srcarg_string_in_buf(ctx,ctx->source_args + 2,local_138,in_RCX);
  allocate_ARB1_scratch_reg_name(ctx,acStack_178,buflen);
  output_line(ctx,"MUL %s, %s, %s;",acStack_178,local_b8,local_f8);
  output_line(ctx,"ADD %s, %s.x, %s.y;",acStack_178,acStack_178,acStack_178);
  output_line(ctx,"ADD%s, %s.x, %s;",local_78,acStack_178,local_138);
  emit_ARB1_dest_modifiers(ctx);
  return;
}

Assistant:

EMIT_ARB1_OPCODE_UNIMPLEMENTED_FUNC(BEM)


static void emit_ARB1_DP2ADD(Context *ctx)
{
    if (support_nv4(ctx))  // nv4 has a built-in equivalent to DP2ADD.
        emit_ARB1_opcode_dsss(ctx, "DP2A");
    else
    {
        char dst[64]; make_ARB1_destarg_string(ctx, dst, sizeof (dst));
        char src0[64]; make_ARB1_srcarg_string(ctx, 0, src0, sizeof (src0));
        char src1[64]; make_ARB1_srcarg_string(ctx, 1, src1, sizeof (src1));
        char src2[64]; make_ARB1_srcarg_string(ctx, 2, src2, sizeof (src2));
        char scratch[64];

        // DP2ADD is:
        //  dst = (src0.r * src1.r) + (src0.g * src1.g) + src2.replicate_swiz
        allocate_ARB1_scratch_reg_name(ctx, scratch, sizeof (scratch));
        output_line(ctx, "MUL %s, %s, %s;", scratch, src0, src1);
        output_line(ctx, "ADD %s, %s.x, %s.y;", scratch, scratch, scratch);
        output_line(ctx, "ADD%s, %s.x, %s;", dst, scratch, src2);
        emit_ARB1_dest_modifiers(ctx);
    } // else
}